

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Functional::FboApiTests::init(FboApiTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  FboApiCase *pFVar1;
  
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"valid_tex2d_attachments",
             "Valid 2D texture attachments",validTex2DAttachmentsTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"valid_texcube_attachments",
             "Valid cubemap attachments",validTexCubeAttachmentsTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"valid_rbo_attachments",
             "Valid renderbuffer attachments",validRboAttachmentsTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"attach_to_default_fbo",
             "Invalid usage: attaching to default FBO",attachToDefaultFramebufferTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"invalid_tex2d_attachments",
             "Invalid 2D texture attachments",invalidTex2DAttachmentTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"invalid_texcube_attachments",
             "Invalid cubemap attachments",invalidTexCubeAttachmentTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"invalid_rbo_attachments",
             "Invalid renderbuffer attachments",invalidRboAttachmentTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"attach_names",
             "Attach allocated names without objects",attachNamesTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"texture_levels",
             "Valid and invalid texturel levels",textureLevelsTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"attachment_query_default_fbo",
             "Query attachments from default FBO",attachmentQueryDefaultFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"attachment_query_empty_fbo",
             "Query attachments from empty FBO",attachmentQueryEmptyFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"attachment_query_tex2d",
             "Query 2d texture attachment properties",attachmentQueryTex2DTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"attachment_query_texcube",
             "Query cubemap attachment properties",attachmentQueryTexCubeTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"attachment_query_rbo",
             "Query renderbuffer attachment properties",attachmentQueryRboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"delete_tex_2d_attached_to_bound_fbo",
             "Delete 2d texture attached to currently bound FBO",deleteTex2DAttachedToBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"delete_tex_cube_attached_to_bound_fbo",
             "Delete cubemap attached to currently bound FBO",deleteTexCubeAttachedToBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"delete_rbo_attached_to_bound_fbo",
             "Delete renderbuffer attached to currently bound FBO",deleteRboAttachedToBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"delete_tex_2d_attached_to_not_bound_fbo",
             "Delete 2d texture attached to FBO",deleteTex2DAttachedToNotBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,
             "delete_tex_cube_attached_to_not_bound_fbo","Delete cubemap attached to FBO",
             deleteTexCubeAttachedToNotBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"delete_rbo_attached_to_not_bound_fbo",
             "Delete renderbuffer attached to FBO",deleteRboAttachedToNotBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  return extraout_EAX;
}

Assistant:

void FboApiTests::init (void)
{
	// Valid attachments
	addChild(new FboApiCase(m_context, "valid_tex2d_attachments",					"Valid 2D texture attachments",							validTex2DAttachmentsTest));
	addChild(new FboApiCase(m_context, "valid_texcube_attachments",					"Valid cubemap attachments",							validTexCubeAttachmentsTest));
	addChild(new FboApiCase(m_context, "valid_rbo_attachments",						"Valid renderbuffer attachments",						validRboAttachmentsTest));

	// Invalid attachments
	addChild(new FboApiCase(m_context, "attach_to_default_fbo",						"Invalid usage: attaching to default FBO",				attachToDefaultFramebufferTest));
	addChild(new FboApiCase(m_context, "invalid_tex2d_attachments",					"Invalid 2D texture attachments",						invalidTex2DAttachmentTest));
	addChild(new FboApiCase(m_context, "invalid_texcube_attachments",				"Invalid cubemap attachments",							invalidTexCubeAttachmentTest));
	addChild(new FboApiCase(m_context, "invalid_rbo_attachments",					"Invalid renderbuffer attachments",						invalidRboAttachmentTest));
	addChild(new FboApiCase(m_context, "attach_names",								"Attach allocated names without objects",				attachNamesTest));

	addChild(new FboApiCase(m_context, "texture_levels",							"Valid and invalid texturel levels",					textureLevelsTest));

	// Attachment queries
	addChild(new FboApiCase(m_context, "attachment_query_default_fbo",				"Query attachments from default FBO",					attachmentQueryDefaultFboTest));
	addChild(new FboApiCase(m_context, "attachment_query_empty_fbo",				"Query attachments from empty FBO",						attachmentQueryEmptyFboTest));
	addChild(new FboApiCase(m_context, "attachment_query_tex2d",					"Query 2d texture attachment properties",				attachmentQueryTex2DTest));
	addChild(new FboApiCase(m_context, "attachment_query_texcube",					"Query cubemap attachment properties",					attachmentQueryTexCubeTest));
	addChild(new FboApiCase(m_context, "attachment_query_rbo",						"Query renderbuffer attachment properties",				attachmentQueryRboTest));

	// Delete attachments
	addChild(new FboApiCase(m_context, "delete_tex_2d_attached_to_bound_fbo",		"Delete 2d texture attached to currently bound FBO",	deleteTex2DAttachedToBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_tex_cube_attached_to_bound_fbo",		"Delete cubemap attached to currently bound FBO",		deleteTexCubeAttachedToBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_rbo_attached_to_bound_fbo",			"Delete renderbuffer attached to currently bound FBO",	deleteRboAttachedToBoundFboTest));

	addChild(new FboApiCase(m_context, "delete_tex_2d_attached_to_not_bound_fbo",	"Delete 2d texture attached to FBO",					deleteTex2DAttachedToNotBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_tex_cube_attached_to_not_bound_fbo",	"Delete cubemap attached to FBO",						deleteTexCubeAttachedToNotBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_rbo_attached_to_not_bound_fbo",		"Delete renderbuffer attached to FBO",					deleteRboAttachedToNotBoundFboTest));
}